

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ControlFlowGraph.cpp
# Opt level: O0

void __thiscall
ControlFlowGraph::ControlFlowGraph(ControlFlowGraph *this,DGLLVMPointerAnalysis *pointsToAnalysis)

{
  GraphBuilder *this_00;
  size_t in_RDI;
  pointer in_stack_ffffffffffffffb8;
  ThreadRegionsBuilder *in_stack_ffffffffffffffe0;
  
  this_00 = (GraphBuilder *)operator_new(0x1c8);
  GraphBuilder::GraphBuilder(this_00,(DGLLVMPointerAnalysis *)in_stack_ffffffffffffffb8);
  std::unique_ptr<GraphBuilder,std::default_delete<GraphBuilder>>::
  unique_ptr<std::default_delete<GraphBuilder>,void>
            ((unique_ptr<GraphBuilder,_std::default_delete<GraphBuilder>_> *)this_00,
             in_stack_ffffffffffffffb8);
  operator_new(0xa0);
  ThreadRegionsBuilder::ThreadRegionsBuilder(in_stack_ffffffffffffffe0,in_RDI);
  std::unique_ptr<ThreadRegionsBuilder,std::default_delete<ThreadRegionsBuilder>>::
  unique_ptr<std::default_delete<ThreadRegionsBuilder>,void>
            ((unique_ptr<ThreadRegionsBuilder,_std::default_delete<ThreadRegionsBuilder>_> *)this_00
             ,(pointer)in_stack_ffffffffffffffb8);
  operator_new(0xf8);
  CriticalSectionsBuilder::CriticalSectionsBuilder((CriticalSectionsBuilder *)this_00);
  std::unique_ptr<CriticalSectionsBuilder,std::default_delete<CriticalSectionsBuilder>>::
  unique_ptr<std::default_delete<CriticalSectionsBuilder>,void>
            ((unique_ptr<CriticalSectionsBuilder,_std::default_delete<CriticalSectionsBuilder>_> *)
             this_00,(pointer)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

ControlFlowGraph::ControlFlowGraph(dg::DGLLVMPointerAnalysis *pointsToAnalysis)
        : graphBuilder(new GraphBuilder(pointsToAnalysis)),
          threadRegionsBuilder(new ThreadRegionsBuilder()),
          criticalSectionsBuilder(new CriticalSectionsBuilder()) {}